

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DisableConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DisableConstraintSyntax,slang::syntax::DisableConstraintSyntax_const&>
          (BumpAllocator *this,DisableConstraintSyntax *args)

{
  undefined4 uVar1;
  DisableConstraintSyntax *pDVar2;
  long lVar3;
  DisableConstraintSyntax *pDVar4;
  byte bVar5;
  
  bVar5 = 0;
  pDVar2 = (DisableConstraintSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DisableConstraintSyntax *)this->endPtr < pDVar2 + 1) {
    pDVar2 = (DisableConstraintSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pDVar2 + 1);
  }
  pDVar4 = pDVar2;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4;
    (pDVar4->super_ConstraintItemSyntax).super_SyntaxNode.kind =
         (args->super_ConstraintItemSyntax).super_SyntaxNode.kind;
    *(undefined4 *)&(pDVar4->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4 = uVar1;
    args = (DisableConstraintSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pDVar4 = (DisableConstraintSyntax *)((long)pDVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pDVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }